

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_tests.c
# Opt level: O0

TestSuite * vector_tests(void)

{
  TestSuite *pTVar1;
  TestSuite *suite;
  
  pTVar1 = (TestSuite *)
           create_named_test_suite_
                     ("vector_tests",
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/vector_tests.c"
                      ,0x92);
  set_setup(pTVar1,set_up_vector);
  set_teardown(pTVar1,tear_down_vector);
  add_test_(pTVar1,"new_vector_is_empty",&CgreenSpec__Vector__new_vector_is_empty__);
  add_test_(pTVar1,"single_item_gives_count_of_one",
            &CgreenSpec__Vector__single_item_gives_count_of_one__);
  add_test_(pTVar1,"single_item_is_readable",&CgreenSpec__Vector__single_item_is_readable__);
  add_test_(pTVar1,"double_item_gives_count_of_two",
            &CgreenSpec__Vector__double_item_gives_count_of_two__);
  add_test_(pTVar1,"two_items_are_readable",&CgreenSpec__Vector__two_items_are_readable__);
  add_test_(pTVar1,"can_extract_only_item",&CgreenSpec__Vector__can_extract_only_item__);
  add_test_(pTVar1,"can_extract_head_item",&CgreenSpec__Vector__can_extract_head_item__);
  add_test_(pTVar1,"can_extract_tail_item",&CgreenSpec__Vector__can_extract_tail_item__);
  add_test_(pTVar1,"can_extract_middle_item",&CgreenSpec__Vector__can_extract_middle_item__);
  add_test_(pTVar1,"destructor_is_called_on_single_item",
            &CgreenSpec__Vector__destructor_is_called_on_single_item__);
  add_test_(pTVar1,"destructor_is_not_called_on_empty_vector",
            &CgreenSpec__Vector__destructor_is_not_called_on_empty_vector__);
  add_test_(pTVar1,"destructor_is_called_three_times_on_three_item_vector",
            &CgreenSpec__Vector__destructor_is_called_three_times_on_three_item_vector__);
  add_test_(pTVar1,"vector_size_of_null_pointer_is_zero",
            &CgreenSpec__Vector__vector_size_of_null_pointer_is_zero__);
  add_test_(pTVar1,"returns_null_for_get_on_illegal_index",
            &CgreenSpec__Vector__returns_null_for_get_on_illegal_index__);
  add_test_(pTVar1,"returns_null_for_remove_from_illegal_index",
            &CgreenSpec__Vector__returns_null_for_remove_from_illegal_index__);
  return pTVar1;
}

Assistant:

TestSuite *vector_tests(void) {
    TestSuite *suite = create_test_suite();
    set_setup(suite, set_up_vector);
    set_teardown(suite, tear_down_vector);
    add_test_with_context(suite, Vector, new_vector_is_empty);
    add_test_with_context(suite, Vector, single_item_gives_count_of_one);
    add_test_with_context(suite, Vector, single_item_is_readable);
    add_test_with_context(suite, Vector, double_item_gives_count_of_two);
    add_test_with_context(suite, Vector, two_items_are_readable);
    add_test_with_context(suite, Vector, can_extract_only_item);
    add_test_with_context(suite, Vector, can_extract_head_item);
    add_test_with_context(suite, Vector, can_extract_tail_item);
    add_test_with_context(suite, Vector, can_extract_middle_item);
    add_test_with_context(suite, Vector, destructor_is_called_on_single_item);
    add_test_with_context(suite, Vector, destructor_is_not_called_on_empty_vector);
    add_test_with_context(suite, Vector, destructor_is_called_three_times_on_three_item_vector);
    add_test_with_context(suite, Vector, vector_size_of_null_pointer_is_zero);
    add_test_with_context(suite, Vector, returns_null_for_get_on_illegal_index);
    add_test_with_context(suite, Vector, returns_null_for_remove_from_illegal_index);
    return suite;
}